

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O1

void __thiscall higan::LogFile::AppendInternal(LogFile *this,char *str,size_t len)

{
  time_t tVar1;
  time_t tVar2;
  size_t sVar3;
  
  tVar1 = time((time_t *)0x0);
  FileForAppend::Append
            ((this->file_ptr_)._M_t.
             super___uniq_ptr_impl<higan::FileForAppend,_std::default_delete<higan::FileForAppend>_>
             ._M_t.
             super__Tuple_impl<0UL,_higan::FileForAppend_*,_std::default_delete<higan::FileForAppend>_>
             .super__Head_base<0UL,_higan::FileForAppend_*,_false>._M_head_impl,str,len);
  if (this->last_flush_time_ + 3 < tVar1) {
    tVar2 = time((time_t *)0x0);
    this->last_flush_time_ = tVar2;
    FileForAppend::Flush
              ((this->file_ptr_)._M_t.
               super___uniq_ptr_impl<higan::FileForAppend,_std::default_delete<higan::FileForAppend>_>
               ._M_t.
               super__Tuple_impl<0UL,_higan::FileForAppend_*,_std::default_delete<higan::FileForAppend>_>
               .super__Head_base<0UL,_higan::FileForAppend_*,_false>._M_head_impl);
    this->last_flush_time_ = tVar1;
  }
  if (this->last_roll_time_ + 0x15180 < tVar1) {
    RollFile(this);
    this->last_roll_time_ = tVar1;
  }
  sVar3 = FileForAppend::GetWriteSumBytes
                    ((this->file_ptr_)._M_t.
                     super___uniq_ptr_impl<higan::FileForAppend,_std::default_delete<higan::FileForAppend>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_higan::FileForAppend_*,_std::default_delete<higan::FileForAppend>_>
                     .super__Head_base<0UL,_higan::FileForAppend_*,_false>._M_head_impl);
  if (0xa00000 < sVar3) {
    RollFile(this);
    return;
  }
  return;
}

Assistant:

void LogFile::AppendInternal(const char* str, size_t len)
{
	time_t now = time(nullptr);

	file_ptr_->Append(str, len);

	if (now > last_flush_time_ + DEFAULT_FLUSH_INTERVAL)
	{
		Flush();
		last_flush_time_ = now;
	}

	if (now > last_roll_time_ + DEFAULT_ROLL_INTERVAL)
	{
		RollFile();
		last_roll_time_ = now;
	}

	if (file_ptr_->GetWriteSumBytes() > DEFAULT_MAX_FILE_SIZE)
	{
		RollFile();
	}
}